

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lclin.cpp
# Opt level: O0

Factor * __thiscall libDAI::LCLin::Hdelpe(LCLin *this,size_t i,Factor *fac,size_t Y,VarSet *ns)

{
  bool bVar1;
  vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_> *__x;
  reference puVar2;
  long *plVar3;
  VarSet *pVVar4;
  TFactor<double> *in_RCX;
  value_type *in_RDX;
  long *in_RSI;
  Factor *in_RDI;
  unsigned_long in_R8;
  vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_> *in_R9;
  size_t K;
  nb_cit I;
  vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_> pfacs;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> facs;
  VarSet *in_stack_00000180;
  LCLin *in_stack_00000188;
  value_type *in_stack_fffffffffffffe78;
  FactorGraph *in_stack_fffffffffffffe80;
  VarSet *this_00;
  value_type *in_stack_fffffffffffffe88;
  LCLin *in_stack_fffffffffffffe90;
  VarSet *local_c8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_78 [3];
  TFactor<double> *in_stack_ffffffffffffffa0;
  TFactor<double> *in_stack_ffffffffffffffa8;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> local_48;
  unsigned_long local_28;
  TFactor<double> *local_20;
  value_type *local_18;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb81083)
  ;
  TFactor<double>::vars(local_20);
  __x = (vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_> *
        )VarSet::size((VarSet *)0xb810a1);
  if (__x != (vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
              *)0x0) {
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  }
  std::vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>::
  vector((vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
          *)0xb810f2);
  (**(code **)(*in_RSI + 0x28))();
  FactorGraph::nbV(in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
  local_78[0]._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe78
                 );
  while( true ) {
    (**(code **)(*in_RSI + 0x28))();
    FactorGraph::nbV(in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe78);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffe80,
                       (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffe78);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(local_78);
    if (*puVar2 != local_28) {
      plVar3 = (long *)(**(code **)(*in_RSI + 0x28))();
      puVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(local_78);
      (**(code **)(*plVar3 + 0x50))(plVar3,*puVar2);
      in_stack_fffffffffffffe88 = local_18;
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator*(local_78);
      in_stack_fffffffffffffe90 =
           (LCLin *)phi(in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88,
                        (size_t)in_stack_fffffffffffffe80);
      TFactor<double>::operator*(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
                ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                 in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffe80);
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)in_stack_fffffffffffffe88,(int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
  }
  local_c8 = (VarSet *)0x0;
  while( true ) {
    this_00 = local_c8;
    pVVar4 = (VarSet *)
             std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::size
                       (&local_48);
    if (pVVar4 <= this_00) break;
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              (&local_48,(size_type)local_c8);
    std::vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>::
    push_back((vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
               *)this_00,(value_type *)in_stack_fffffffffffffe78);
    local_c8 = (VarSet *)
               ((long)&(local_c8->_vars).
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  VarSet::VarSet(this_00,&in_stack_fffffffffffffe78->_vs);
  std::vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>::
  vector(in_R9,__x);
  notSumProd(in_stack_00000188,in_stack_00000180,
             (vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
              *)this);
  std::vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>::
  ~vector((vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
           *)in_stack_fffffffffffffe90);
  VarSet::~VarSet((VarSet *)0xb8139c);
  std::vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>::
  ~vector((vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
           *)in_stack_fffffffffffffe90);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
             in_stack_fffffffffffffe90);
  return in_RDI;
}

Assistant:

Factor LCLin::Hdelpe( size_t i, const Factor &fac, size_t Y, VarSet ns ) {
        std::vector<Factor> facs;
        if( fac.vars().size() )
            facs.push_back( fac );
        std::vector<const Factor *> pfacs;
        for( FactorGraph::nb_cit I = grm().nbV(i).begin(); I != grm().nbV(i).end(); I++ )
            if( *I != Y )
                facs.push_back( grm().factor(*I) * phi(i,*I) );
        for( size_t K = 0; K < facs.size(); K++ )
            pfacs.push_back( &(facs[K]) );
        return notSumProd( ns, pfacs );
    }